

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  
  while (uVar1 = *(byte *)&this->field_0 & 0xf, uVar1 - 8 < 2) {
    this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
            ((long)&this->field_0 + 8);
  }
  if (uVar1 == 3) {
    bVar3 = true;
  }
  else if (uVar1 == 2) {
    lVar2 = as_integer<long>(this);
    bVar3 = -1 < lVar2;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool is_uint64() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::uint64:
                    return true;
                case json_storage_kind::int64:
                    return as_integer<int64_t>() >= 0;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_uint64();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_uint64();
                default:
                    return false;
            }
        }